

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O1

size_t __thiscall std::hash<docopt::value>::operator()(hash<docopt::value> *this,value *val)

{
  pointer pbVar1;
  size_t sVar2;
  size_t sVar3;
  const_iterator __end3;
  const_iterator __begin3;
  pointer __s;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hasher;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2a;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_29;
  
  switch(val->kind) {
  case Bool:
    sVar3 = (size_t)(val->variant).boolValue;
    break;
  case Long:
    sVar3 = (val->variant).longValue;
    break;
  case String:
    sVar3 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()(&local_2a,&(val->variant).strValue);
    break;
  case StringList:
    __s = (val->variant).strList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (val->variant).strList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar3 = (long)pbVar1 - (long)__s >> 5;
    if (pbVar1 != __s) {
      do {
        sVar2 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()(&local_29,__s);
        sVar3 = sVar3 ^ (sVar3 >> 2) + sVar3 * 0x40 + sVar2 + 0x9e3779b9;
        __s = __s + 1;
      } while (__s != pbVar1);
    }
    break;
  default:
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

inline
	size_t value::hash() const noexcept
	{
		switch (kind) {
			case Kind::String:
				return std::hash<std::string>()(variant.strValue);

			case Kind::StringList: {
				size_t seed = std::hash<size_t>()(variant.strList.size());
				for(auto const& str : variant.strList) {
					hash_combine(seed, str);
				}
				return seed;
			}

			case Kind::Bool:
				return std::hash<bool>()(variant.boolValue);

			case Kind::Long:
				return std::hash<long>()(variant.longValue);

			case Kind::Empty:
			default:
				return std::hash<void*>()(nullptr);
		}
	}